

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

bool cfd::core::HDWallet::CheckValidMnemonic
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *mnemonic,string *language)

{
  bool bVar1;
  CfdException *this;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  string *local_18;
  string *language_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *mnemonic_local;
  
  local_18 = language;
  language_local = (string *)mnemonic;
  bVar1 = CheckSupportedLanguages(language);
  if (!bVar1) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x181;
    local_30.funcname = "CheckValidMnemonic";
    logger::warn<std::__cxx11::string_const&>
              (&local_30,"Not support language passed. language=[{}]",local_18);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"Not support language passed.",&local_51);
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_50);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = WallyUtil::CheckValidMnemonic
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)language_local,local_18);
  return bVar1;
}

Assistant:

bool HDWallet::CheckValidMnemonic(
    const std::vector<std::string>& mnemonic, const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::CheckValidMnemonic(mnemonic, language);
}